

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemAloha.cpp
# Opt level: O2

void __thiscall ProblemAloha::SetYScopes(ProblemAloha *this)

{
  bool bVar1;
  Index i;
  ulong uVar2;
  Index yI1;
  Index y;
  Scope a;
  Scope x;
  allocator<char> local_b1;
  TwoStageDynamicBayesianNetwork *local_b0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  string local_68;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_b0 = &(this->super_FactoredDecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscreteFactoredStates._m_2dbn;
  uVar2 = 0;
  while (i = (Index)uVar2, uVar2 < this->_m_nrIslands) {
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    Scope::Insert((Scope *)&local_88,i);
    Scope::Insert((Scope *)&local_a8,i);
    uVar2 = 0;
    while (y = (Index)uVar2, uVar2 < this->_m_nrIslands) {
      bVar1 = areNeighbors(this,i,y);
      if (bVar1) {
        Scope::Insert((Scope *)&local_88,y);
        Scope::Insert((Scope *)&local_a8,y);
      }
      uVar2 = (ulong)(y + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"<>",&local_b1);
    Scope::Scope((Scope *)&local_48,&local_68);
    TwoStageDynamicBayesianNetwork::SetSoI_Y
              (local_b0,i,(Scope *)&local_88,(Scope *)&local_a8,(Scope *)&local_48);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_a8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_88);
    uVar2 = (ulong)(i + 1);
  }
  return;
}

Assistant:

void ProblemAloha::SetYScopes()
{    
//specify connections for the 2DBN

    for(Index yI=0; yI < _m_nrIslands; yI++)
    {
        //determine the X scope of influence (i.e., state factors at prev.stage)
        Scope x;
        Scope a;
        // depends on your own state and action
        x.Insert(yI);
        a.Insert(yI);
        for(Index yI1=0; yI1 < _m_nrIslands; yI1++)
            if(areNeighbors(yI,yI1)) // and on your neighbors
            {
                x.Insert(yI1);
                a.Insert(yI1);
            }

        SetSoI_Y( yI,
                  x,
                  a,
                  Scope("<>") // no interdependencies in next stage
            );
    }
}